

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O1

void __thiscall
GmmLib::GmmPageTableMgr::__ReleaseUnusedPool(GmmPageTableMgr *this,GMM_UMD_SYNCCONTEXT *UmdContext)

{
  GMM_DEVICE_CALLBACKS_INT *pDeviceCb;
  GMM_CLIENT ClientType;
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  GMM_DDI_WAITFORSYNCHRONIZATIONOBJECTFROMCPU GVar4;
  HANDLE pvVar5;
  GmmPageTablePool *pGVar6;
  GmmPageTablePool *this_00;
  GMM_GFX_SIZE_T GVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 local_98 [8];
  GMM_DEVICE_DEALLOC Dealloc;
  GMM_DDI_WAITFORSYNCHRONIZATIONOBJECTFROMCPU local_58;
  GMM_DDI_WAITFORSYNCHRONIZATIONOBJECTFROMCPU Wait;
  GMM_GFX_SIZE_T local_48;
  GMM_GFX_SIZE_T PoolSizeToFree;
  GMM_CLIENT local_34;
  
  local_48 = 0;
  PoolSizeToFree = (GMM_GFX_SIZE_T)this;
  if (this->pClientContext == (GmmClientContext *)0x0) {
    local_34 = GMM_UNDEFINED_CLIENT;
  }
  else {
    local_34 = (*this->pClientContext->_vptr_GmmClientContext[2])();
  }
  if (*(long *)(PoolSizeToFree + 0x10) != 0) {
    pthread_mutex_lock((pthread_mutex_t *)(PoolSizeToFree + 0x30));
  }
  bVar1 = GmmPageTablePool::__IsUnusedTRTTPoolOverLimit
                    (*(GmmPageTablePool **)(PoolSizeToFree + 0x18),&local_48);
  GVar7 = PoolSizeToFree;
  if (((bVar1) && (*(int *)(PoolSizeToFree + 0x20) != 0)) && (local_48 != 0)) {
    Wait.bo = (void *)(PoolSizeToFree + 0x18);
    pDeviceCb = (GMM_DEVICE_CALLBACKS_INT *)(PoolSizeToFree + 0x80);
    uVar9 = 1;
    uVar8 = 0;
    pGVar6 = (GmmPageTablePool *)0x0;
    do {
      ClientType = local_34;
      GVar4.bo = &pGVar6->NextPool;
      if (pGVar6 == (GmmPageTablePool *)0x0) {
        GVar4.bo = Wait.bo;
      }
      if (UmdContext == (GMM_UMD_SYNCCONTEXT *)0x0) {
        uVar3 = 1;
        pvVar5 = (HANDLE)0x0;
      }
      else {
        pvVar5 = UmdContext->BBFenceObj;
        uVar3 = UmdContext->BBLastFence + 1;
      }
      this_00 = (GmmPageTablePool *)((GmmClientContext *)GVar4.bo)->_vptr_GmmClientContext;
      if ((0x1ff < this_00->NumFreeNodes) &&
         (((this_00->PoolBBInfo).BBQueueHandle != pvVar5 || ((this_00->PoolBBInfo).BBFence != uVar3)
          ))) {
        Dealloc.hCsr = pGVar6;
        iVar2 = GmmCheckForNullDevCbPfn(local_34,pDeviceCb,GMM_DEV_CB_WAIT_FROM_CPU);
        if (iVar2 != 0) {
          local_58.bo = this_00->PoolHandle;
          GmmDeviceCallback(ClientType,pDeviceCb,&local_58);
        }
        GVar7 = PoolSizeToFree;
        local_98 = (undefined1  [8])this_00->PoolHandle;
        Dealloc.Handle = (HANDLE)this_00->PoolGfxAddress;
        Dealloc.GfxVA = (GMM_GFX_ADDRESS)this_00->pGmmResInfo;
        Dealloc.Priv = *(void **)(PoolSizeToFree + 0xd8);
        __GmmDeviceDealloc(ClientType,pDeviceCb,(GMM_DEVICE_DEALLOC *)local_98,
                           (GmmClientContext *)GVar4.bo);
        pvVar5 = Dealloc.hCsr;
        GVar4.bo = &pGVar6->NextPool;
        if (Dealloc.hCsr == (HANDLE)0x0) {
          GVar4 = Wait;
        }
        *(GmmPageTablePool **)GVar4.bo = this_00->NextPool;
        GmmPageTablePool::~GmmPageTablePool(this_00);
        operator_delete(this_00);
        uVar8 = uVar8 + 0x200000;
        this_00 = (GmmPageTablePool *)pvVar5;
      }
    } while ((uVar9 < *(uint *)(GVar7 + 0x20)) &&
            (uVar9 = uVar9 + 1, pGVar6 = this_00, uVar8 < local_48));
  }
  if (*(long *)(GVar7 + 0x10) != 0) {
    pthread_mutex_unlock((pthread_mutex_t *)(GVar7 + 0x30));
  }
  return;
}

Assistant:

void GmmLib::GmmPageTableMgr::__ReleaseUnusedPool(GMM_UMD_SYNCCONTEXT *UmdContext)
{
    GMM_STATUS                 Status         = GMM_SUCCESS;
    GMM_GFX_SIZE_T             PoolSizeToFree = {0};
    GMM_GFX_SIZE_T             FreedSize      = {0};
    GmmLib::GMM_PAGETABLEPool *Pool = NULL, *PrevPool = NULL;
    uint32_t                   i = 0;
    GMM_CLIENT                 ClientType;
    GMM_DEVICE_DEALLOC         Dealloc;

    GET_GMM_CLIENT_TYPE(pClientContext, ClientType);

    ENTER_CRITICAL_SECTION
    if(pPool->__IsUnusedTRTTPoolOverLimit(&PoolSizeToFree))
    {
        for(i = 0; i < NumNodePoolElements && FreedSize < PoolSizeToFree; i++)
        {
            Pool = (PrevPool) ? PrevPool->GetNextPool() : pPool;

            if(Pool->IsPoolInUse(UmdContext ? SyncInfo(UmdContext->BBFenceObj, UmdContext->BBLastFence) : SyncInfo()))
            {
                PrevPool = Pool;
                continue;
            }

            if(GmmCheckForNullDevCbPfn(ClientType, &DeviceCbInt, GMM_DEV_CB_WAIT_FROM_CPU))
            {
                GMM_DDI_WAITFORSYNCHRONIZATIONOBJECTFROMCPU Wait = {0};
                Wait.bo                                          = Pool->GetPoolHandle();
                GmmDeviceCallback(ClientType, &DeviceCbInt, &Wait);
            }

            Dealloc.Handle = Pool->GetPoolHandle();
            Dealloc.GfxVA  = Pool->GetGfxAddress();
            Dealloc.Priv   = Pool->GetGmmResInfo();
            Dealloc.hCsr   = hCsr;

            Status = __GmmDeviceDealloc(ClientType, &DeviceCbInt, &Dealloc, pClientContext);

            __GMM_ASSERT(GMM_SUCCESS == Status);

            if(PrevPool)
            {
                PrevPool->GetNextPool() = Pool->GetNextPool();
            }
            else
            {
                pPool = Pool->GetNextPool();
            }
            delete Pool;
            FreedSize += PAGETABLE_POOL_SIZE;
        }
    }
    EXIT_CRITICAL_SECTION
}